

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::ascii::Identifier>::
initialize<tinyusdz::ascii::Identifier>
          (optional<tinyusdz::ascii::Identifier> *this,Identifier *value)

{
  if (this->has_value_ != true) {
    std::__cxx11::string::string((string *)&this->contained,(string *)value);
    this->has_value_ = true;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::ascii::Identifier>::initialize(V &&) [T = tinyusdz::ascii::Identifier, V = tinyusdz::ascii::Identifier]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }